

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_compute.cpp
# Opt level: O1

void create_command_pool(Init *init,Data *data)

{
  VkCommandPoolCreateInfo pool_info;
  VkCommandBufferAllocateInfo allocate_info;
  undefined1 local_58 [32];
  anon_union_24_2_293c120a_for_Result<unsigned_int>_1 local_38;
  undefined8 uStack_20;
  
  local_58._8_8_ = (void *)0x0;
  local_58._16_4_ = 0;
  local_58._20_4_ = 0;
  local_58._0_8_ = 0x27;
  vkb::Device::get_queue_index((Result<unsigned_int> *)&local_38.m_error,&init->device,graphics);
  if ((char)uStack_20 != '\0') {
    local_58._20_4_ = local_38.m_value;
    (*(init->disp).fp_vkCreateCommandPool)
              ((init->disp).device,(VkCommandPoolCreateInfo *)local_58,(VkAllocationCallbacks *)0x0,
               &data->command_pool);
    local_38.m_error.type._M_cat = (error_category *)0x0;
    local_38._0_8_ = 0x28;
    local_38._16_8_ = data->command_pool;
    uStack_20 = 0x100000000;
    (*(init->disp).fp_vkAllocateCommandBuffers)
              ((init->disp).device,(VkCommandBufferAllocateInfo *)&local_38.m_error,
               &data->command_buffer);
    return;
  }
  __assert_fail("m_init",
                "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/src/VkBootstrap.h"
                ,0x89,"T vkb::Result<unsigned int>::value() && [T = unsigned int]");
}

Assistant:

void create_command_pool(Init& init, Data& data) {
    VkCommandPoolCreateInfo pool_info = {};
    pool_info.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
    pool_info.queueFamilyIndex = init.device.get_queue_index(vkb::QueueType::graphics).value();
    init.disp.createCommandPool(&pool_info, nullptr, &data.command_pool);

    VkCommandBufferAllocateInfo allocate_info = {};
    allocate_info.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
    allocate_info.commandPool = data.command_pool;
    allocate_info.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
    allocate_info.commandBufferCount = 1;
    init.disp.allocateCommandBuffers(&allocate_info, &data.command_buffer);
}